

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall Json::StreamWriterBuilder::StreamWriterBuilder(StreamWriterBuilder *this)

{
  anon_struct_4_2_14fb5ae2_for_bits_ *paVar1;
  
  (this->super_Factory)._vptr_Factory = (_func_int **)&PTR__StreamWriterBuilder_001507e8;
  paVar1 = &(this->settings_).bits_;
  *(ushort *)paVar1 = *(ushort *)paVar1 & 0xfe00;
  (this->settings_).comments_.ptr_._M_t.
  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  .
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ._M_head_impl =
       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
        *)0x0;
  (this->settings_).start_ = 0;
  (this->settings_).limit_ = 0;
  setDefaults(&this->settings_);
  return;
}

Assistant:

StreamWriterBuilder::StreamWriterBuilder() { setDefaults(&settings_); }